

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListWindow.cpp
# Opt level: O1

void __thiscall cursespp::ListWindow::PageUp(ListWindow *this)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  
  (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable
    [0x42])();
  (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable
    [0x41])(this);
  sVar2 = ScrollableWindow::GetPreviousPageEntryIndex(&this->super_ScrollableWindow);
  iVar3 = 0;
  if (0 < (int)sVar2) {
    iVar3 = (int)sVar2 + 1;
  }
  iVar1 = iVar3 + 1;
  if (iVar3 == 0) {
    iVar1 = 0;
  }
  (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable
    [0x46])(this,(long)iVar1);
  (*(this->super_ScrollableWindow).super_Window.super_IWindow.super_IOrderable._vptr_IOrderable
    [0x44])(this,(long)iVar3);
  return;
}

Assistant:

void ListWindow::PageUp() {
    IScrollAdapter &adapter = this->GetScrollAdapter();
    ScrollPos spos = this->GetScrollPosition();
    int target = (int) this->GetPreviousPageEntryIndex();

    /* if the target position is zero, let it be so the user can see
    the top of the list. otherwise, scroll down by one to give indication
    there is more to see. */
    target = (target > 0) ? target + 1 : 0;

    this->SetSelectedIndex((target == 0) ? 0 : target + 1);
    this->ScrollTo(target);
}